

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float32_unordered_aarch64(float32 a,float32 b,float_status *status)

{
  float32 a_00;
  float32 a_01;
  int iVar1;
  uint32_t uVar2;
  float_status *status_local;
  float32 b_local;
  float32 a_local;
  
  a_00 = float32_squash_input_denormal_aarch64(a,status);
  a_01 = float32_squash_input_denormal_aarch64(b,status);
  iVar1 = extractFloat32Exp(a_00);
  if (iVar1 == 0xff) {
    uVar2 = extractFloat32Frac(a_00);
    if (uVar2 == 0) goto LAB_006ab32c;
LAB_006ab348:
    float_raise_aarch64('\x01',status);
    b_local = 1;
  }
  else {
LAB_006ab32c:
    iVar1 = extractFloat32Exp(a_01);
    if (iVar1 == 0xff) {
      uVar2 = extractFloat32Frac(a_01);
      if (uVar2 != 0) goto LAB_006ab348;
    }
    b_local = 0;
  }
  return b_local;
}

Assistant:

int float32_unordered(float32 a, float32 b, float_status *status)
{
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 1;
    }
    return 0;
}